

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall soul::AST::CommaSeparatedList::~CommaSeparatedList(CommaSeparatedList *this)

{
  ~CommaSeparatedList(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

CommaSeparatedList (const Context& c)
            : Expression (ObjectType::CommaSeparatedList, c, ExpressionKind::unknown)
        {
        }